

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_medium.h
# Opt level: O1

bool __thiscall constant_medium::hit(constant_medium *this,ray *r,interval ray_t,hit_record *rec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  element_type *peVar4;
  double dVar5;
  int iVar6;
  bool bVar7;
  double dVar8;
  hit_record rec2;
  hit_record rec1;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  double local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  double local_48;
  
  local_58 = 0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_b8 = 0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  iVar6 = (*((this->boundary).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_hittable[2])(SUB84(interval::universe.min,0),interval::universe.max);
  if ((char)iVar6 != '\0') {
    peVar4 = (this->boundary).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar6 = (*peVar4->_vptr_hittable[2])
                      (SUB84(local_48 + 0.0001,0),0x7ff0000000000000,peVar4,r,&local_e8);
    if ((char)iVar6 != '\0') {
      if (local_48 < ray_t.min) {
        local_48 = ray_t.min;
      }
      if (ray_t.max < local_a8) {
        local_a8 = ray_t.max;
      }
      if (local_48 < local_a8) {
        if (local_48 < 0.0) {
          local_48 = 0.0;
        }
        dVar1 = (r->dir).e[0];
        dVar2 = (r->dir).e[1];
        dVar3 = (r->dir).e[2];
        dVar1 = dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2;
        if (dVar1 < 0.0) {
          dVar1 = sqrt(dVar1);
        }
        else {
          dVar1 = SQRT(dVar1);
        }
        dVar8 = (local_a8 - local_48) * dVar1;
        dVar2 = this->neg_inv_density;
        iVar6 = rand();
        dVar3 = log((double)iVar6 * 4.656612873077393e-10);
        dVar3 = dVar3 * dVar2;
        bVar7 = dVar3 <= dVar8;
        if (dVar3 <= dVar8) {
          dVar5 = dVar3 / dVar1 + local_48;
          rec->t = dVar5;
          dVar1 = (r->dir).e[1];
          dVar2 = (r->dir).e[2];
          dVar3 = (r->orig).e[1];
          dVar8 = (r->orig).e[2];
          (rec->p).e[0] = (r->dir).e[0] * dVar5 + (r->orig).e[0];
          (rec->p).e[1] = dVar1 * dVar5 + dVar3;
          (rec->p).e[2] = dVar5 * dVar2 + dVar8;
          (rec->normal).e[0] = 1.0;
          (rec->normal).e[1] = 0.0;
          (rec->normal).e[2] = 0.0;
          rec->front_face = true;
          (rec->mat).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this->phase_function).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(rec->mat).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(this->phase_function).
                      super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          bVar7 = true;
        }
        goto LAB_0011fe90;
      }
    }
  }
  bVar7 = false;
LAB_0011fe90:
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  return bVar7;
}

Assistant:

bool hit(const ray& r, interval ray_t, hit_record& rec) const override {
        hit_record rec1, rec2;

        if (!boundary->hit(r, interval::universe, rec1))
            return false;

        if (!boundary->hit(r, interval(rec1.t+0.0001, infinity), rec2))
            return false;

        if (rec1.t < ray_t.min) rec1.t = ray_t.min;
        if (rec2.t > ray_t.max) rec2.t = ray_t.max;

        if (rec1.t >= rec2.t)
            return false;

        if (rec1.t < 0)
            rec1.t = 0;

        auto ray_length = r.direction().length();
        auto distance_inside_boundary = (rec2.t - rec1.t) * ray_length;
        auto hit_distance = neg_inv_density * std::log(random_double());

        if (hit_distance > distance_inside_boundary)
            return false;

        rec.t = rec1.t + hit_distance / ray_length;
        rec.p = r.at(rec.t);

        rec.normal = vec3(1,0,0);  // arbitrary
        rec.front_face = true;     // also arbitrary
        rec.mat = phase_function;

        return true;
    }